

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_line.cpp
# Opt level: O3

void arrow_line_x_validate(Am_Web_Events *events)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  int value;
  int value_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Am_Value *pAVar7;
  ulong uVar8;
  char *pcVar9;
  ostream *poVar10;
  Am_Object self;
  Am_Style ls;
  Am_Slot slot;
  Am_Object local_60;
  uint local_54;
  int local_50;
  int local_4c;
  Am_Object local_48;
  uint local_40;
  int local_3c;
  Am_Slot local_38;
  
  Am_Web_Events::Start(events);
  local_38 = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_48);
  Am_Object::Am_Object(&local_60,&local_48);
  Am_Object::~Am_Object(&local_48);
  pAVar7 = Am_Object::Get(&local_60,0x8b,0);
  value = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_60,0x8d,0);
  value_00 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_60,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_60,0x66,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_60,0x90,0);
  local_54 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_60,0x91,0);
  uVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_60,0x6b,0);
  Am_Style::Am_Style((Am_Style *)&local_48,pAVar7);
  get_thickness_adjustments((Am_Style *)&local_48,&local_50,&local_4c,&local_3c);
  if ((int)uVar5 < (int)local_54) {
    uVar5 = local_54;
  }
  local_50 = local_50 + uVar5;
  local_4c = local_4c + uVar5;
  local_3c = local_3c + uVar5 * 2;
  local_40 = 0;
  local_54 = 0;
  while( true ) {
    bVar1 = Am_Web_Events::Last(events);
    if (bVar1) {
      if ((local_54 & 1) != 0) {
        Am_Object::Set(&local_60,0x8b,value,0);
        Am_Object::Set(&local_60,0x8d,value_00,0);
      }
      if ((local_40 & 1) != 0) {
        Am_Object::Set(&local_60,100,iVar3,0);
        Am_Object::Set(&local_60,0x66,iVar4,0);
      }
      Am_Style::~Am_Style((Am_Style *)&local_48);
      Am_Object::~Am_Object(&local_60);
      return;
    }
    local_38 = Am_Web_Events::Get(events);
    AVar2 = Am_Slot::Get_Key(&local_38);
    uVar5 = AVar2 - 100;
    uVar8 = (ulong)uVar5;
    if (0x2d < uVar5) break;
    if ((0x300000000080U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((5UL >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x28000000000U >> (uVar8 & 0x3f) & 1) == 0) break;
        iVar6 = value - value_00;
        iVar3 = value_00;
        if (value < value_00) {
          iVar3 = value;
        }
        iVar3 = iVar3 - local_50;
        iVar4 = iVar6;
        if (iVar6 < 0) {
          iVar4 = -iVar6;
        }
        iVar4 = iVar4 + local_3c;
        local_40 = (uint)CONCAT71((uint7)(uint3)((uint)-iVar6 >> 8),1);
      }
      else {
        if (value < value_00) {
          value = local_50 + iVar3;
          value_00 = (iVar4 + iVar3) - local_4c;
        }
        else {
          value = (iVar4 + iVar3) - local_4c;
          value_00 = local_50 + iVar3;
        }
        local_54 = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
      }
    }
    Am_Web_Events::Next(events);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"** Bug: unexpected slot in arrow_line_x_validate: ",0x32);
  AVar2 = Am_Slot::Get_Key(&local_38);
  pcVar9 = Am_Get_Slot_Name(AVar2);
  poVar10 = std::operator<<((ostream *)&std::cerr,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar10);
  Am_Error();
}

Assistant:

static void
arrow_line_x_validate(Am_Web_Events &events)
{
  bool x1x2_changed = false;
  bool leftwidth_changed = false;

  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  int x1 = self.Get(Am_X1);
  int x2 = self.Get(Am_X2);
  int left = self.Get(Am_LEFT);
  int width = self.Get(Am_WIDTH);
  int head_length = self.Get(Am_HEAD_LENGTH);
  int head_width = self.Get(Am_HEAD_WIDTH);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int lt_adjustment, rb_adjustment, wh_adjustment;
  get_thickness_adjustments(ls, lt_adjustment, rb_adjustment, wh_adjustment);
  if (head_length > head_width) {
    lt_adjustment += head_length;
    rb_adjustment += head_length;
    wh_adjustment += 2 * head_length;
  } else {
    lt_adjustment += head_width;
    rb_adjustment += head_width;
    wh_adjustment += 2 * head_width;
  }
  while (!events.Last()) {
    slot = events.Get();
    //std::cout << "__Line_x_Web " << self << " slot " << slot.Get_Key ()
    //  << " l,w,x1,x2 " << left << " " << width << " " << x1 << " " << x2
    //	 <<std::endl <<std::flush;
    switch (slot.Get_Key()) {
    case Am_X1:
    case Am_X2:
      left = imin(x1, x2) - lt_adjustment;
      width = iabs(x2 - x1) + wh_adjustment;
      leftwidth_changed = true;
      //std::cout << "__  left " << left << " width " << width <<std::endl <<std::flush;
      break;
    case Am_LEFT:
    case Am_WIDTH:
      if (x1 < x2) {
        x1 = left + lt_adjustment;
        x2 = left + width - rb_adjustment;
      } else {
        x1 = left + width - rb_adjustment;
        x2 = left + lt_adjustment;
      }
      x1x2_changed = true;
      //std::cout << "__  x1 " << x1 << " x2 " << x2 <<std::endl <<std::flush;
      break;
    case Am_LINE_STYLE:
    case Am_HEAD_WIDTH:
    case Am_HEAD_LENGTH:
      break;
    default:
      Am_ERROR("** Bug: unexpected slot in arrow_line_x_validate: "
               << Am_Get_Slot_Name(slot.Get_Key()));
    }
    events.Next();
  }

  if (x1x2_changed) {
    self.Set(Am_X1, x1);
    self.Set(Am_X2, x2);
  }

  if (leftwidth_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_WIDTH, width);
  }
}